

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest_test_compression_of_big_buffer_in_chunks_Test::
TestBody(ZLIBBufferCompressorTest_test_compression_of_big_buffer_in_chunks_Test *this)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  char *__args;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  int local_3c;
  int local_38;
  int j;
  int i;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> input_buffer;
  ZLIBBufferCompressorTest_test_compression_of_big_buffer_in_chunks_Test *this_local;
  
  input_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  lVar1 = std::__cxx11::string::size();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,lVar1 << 10);
  for (local_38 = 0; local_38 < 0x400; local_38 = local_38 + 1) {
    local_3c = 0;
    while( true ) {
      uVar2 = (ulong)local_3c;
      uVar3 = std::__cxx11::string::size();
      if (uVar3 <= uVar2) break;
      __args = (char *)std::__cxx11::string::operator[]
                                 ((ulong)&(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_28,__args);
      local_3c = local_3c + 1;
    }
  }
  ZLIBBufferCompressorTest::TestCompression
            (&local_58,&this->super_ZLIBBufferCompressorTest,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0x10000);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, test_compression_of_big_buffer_in_chunks)
{
    std::vector<unsigned char> input_buffer;
    input_buffer.reserve(BIGGER_TEXT.size() * 1024);
    for (int i = 0; i < 1024; i++)
    {
        for (int j = 0; j < BIGGER_TEXT.size(); j++)
        {
            input_buffer.emplace_back(BIGGER_TEXT[j]);
        }
    }

    TestCompression(input_buffer, 65536);
}